

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall icu_63::double_conversion::Bignum::BigitsShiftLeft(Bignum *this,int shift_amount)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  iVar3 = this->used_digits_;
  if (iVar3 < 1) {
    uVar5 = 0;
  }
  else {
    puVar2 = (this->bigits_).start_;
    lVar6 = 0;
    uVar4 = 0;
    do {
      uVar1 = puVar2[lVar6];
      uVar5 = uVar1 >> (0x1c - (byte)shift_amount & 0x1f);
      puVar2[lVar6] = (uVar1 << ((byte)shift_amount & 0x1f)) + uVar4 & 0xfffffff;
      lVar6 = lVar6 + 1;
      iVar3 = this->used_digits_;
      uVar4 = uVar5;
    } while (lVar6 < iVar3);
  }
  if (uVar5 != 0) {
    (this->bigits_).start_[iVar3] = uVar5;
    this->used_digits_ = this->used_digits_ + 1;
  }
  return;
}

Assistant:

void Bignum::BigitsShiftLeft(int shift_amount) {
  ASSERT(shift_amount < kBigitSize);
  ASSERT(shift_amount >= 0);
  Chunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    Chunk new_carry = bigits_[i] >> (kBigitSize - shift_amount);
    bigits_[i] = ((bigits_[i] << shift_amount) + carry) & kBigitMask;
    carry = new_carry;
  }
  if (carry != 0) {
    bigits_[used_digits_] = carry;
    used_digits_++;
  }
}